

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

void __thiscall CTcSymEnumBase::~CTcSymEnumBase(CTcSymEnumBase *this)

{
  CTcSymbol::~CTcSymbol((CTcSymbol *)0x2b5c0e);
  return;
}

Assistant:

CTcSymEnumBase(const char *str, size_t len, int copy, ulong id,
                   int is_token)
        : CTcSymbol(str, len, copy, TC_SYM_ENUM)
    {
        /* remember my ID */
        enum_id_ = id;

        /* remember if it's a 'token' enum */
        is_token_ = is_token;

        /* not yet referenced */
        ref_ = FALSE;
    }